

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall ACSStringPool::ReadStrings(ACSStringPool *this,FSerializer *file,char *key)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  DWORD DVar4;
  PoolEntry *pPVar5;
  FSerializer *this_00;
  char *pcVar6;
  size_t len;
  uint bucketnum;
  uint h;
  uint ii;
  int i;
  int j;
  PoolEntry *p;
  iterator __end2;
  iterator __begin2;
  TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry> *__range2;
  char *pcStack_20;
  int poolsize;
  char *key_local;
  FSerializer *file_local;
  ACSStringPool *this_local;
  
  pcStack_20 = key;
  key_local = (char *)file;
  file_local = (FSerializer *)this;
  Clear(this);
  bVar2 = FSerializer::BeginObject((FSerializer *)key_local,pcStack_20);
  if (bVar2) {
    __range2._4_4_ = 0;
    FSerializer::operator()((FSerializer *)key_local,"poolsize",(int *)((long)&__range2 + 4));
    TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Resize(&this->Pool,__range2._4_4_);
    __end2 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::begin(&this->Pool);
    p = (PoolEntry *)TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::end(&this->Pool);
    while (bVar2 = TIterator<ACSStringPool::PoolEntry>::operator!=
                             (&__end2,(TIterator<ACSStringPool::PoolEntry> *)&p), bVar2) {
      _i = TIterator<ACSStringPool::PoolEntry>::operator*(&__end2);
      _i->Next = 0xfffffffe;
      _i->LockCount = 0;
      TIterator<ACSStringPool::PoolEntry>::operator++(&__end2);
    }
    bVar2 = FSerializer::BeginArray((FSerializer *)key_local,"pool");
    if (bVar2) {
      ii = FSerializer::ArraySize((FSerializer *)key_local);
      for (h = 0; (int)h < (int)ii; h = h + 1) {
        bVar2 = FSerializer::BeginObject((FSerializer *)key_local,(char *)0x0);
        if (bVar2) {
          bucketnum = 0xffffffff;
          FSerializer::operator()((FSerializer *)key_local,"index",&bucketnum);
          uVar1 = bucketnum;
          uVar3 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Size(&this->Pool);
          pcVar6 = key_local;
          if (uVar1 < uVar3) {
            pPVar5 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                               (&this->Pool,(ulong)bucketnum);
            this_00 = FSerializer::operator()((FSerializer *)pcVar6,"string",&pPVar5->Str);
            pPVar5 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                               (&this->Pool,(ulong)bucketnum);
            FSerializer::operator()(this_00,"lockcount",&pPVar5->LockCount);
            pPVar5 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                               (&this->Pool,(ulong)bucketnum);
            pcVar6 = FString::operator_cast_to_char_(&pPVar5->Str);
            pPVar5 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                               (&this->Pool,(ulong)bucketnum);
            len = FString::Len(&pPVar5->Str);
            DVar4 = SuperFastHash(pcVar6,len);
            pPVar5 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                               (&this->Pool,(ulong)bucketnum);
            pPVar5->Hash = DVar4;
            uVar1 = this->PoolBuckets[DVar4 % 0xfb];
            pPVar5 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                               (&this->Pool,(ulong)bucketnum);
            pPVar5->Next = uVar1;
            this->PoolBuckets[DVar4 % 0xfb] = bucketnum;
          }
          FSerializer::EndObject((FSerializer *)key_local);
        }
      }
    }
  }
  return;
}

Assistant:

void ACSStringPool::ReadStrings(FSerializer &file, const char *key)
{
	Clear();

	if (file.BeginObject(key))
	{
		int poolsize = 0;

		file("poolsize", poolsize);
		Pool.Resize(poolsize);
		for (auto &p : Pool)
		{
			p.Next = FREE_ENTRY;
			p.LockCount = 0;
		}
		if (file.BeginArray("pool"))
		{
			int j = file.ArraySize();
			for (int i = 0; i < j; i++)
			{
				if (file.BeginObject(nullptr))
				{
					unsigned ii = UINT_MAX;
					file("index", ii);
					if (ii < Pool.Size())
					{
						file("string", Pool[ii].Str)
							("lockcount", Pool[ii].LockCount);

						unsigned h = SuperFastHash(Pool[ii].Str, Pool[ii].Str.Len());
						unsigned bucketnum = h % NUM_BUCKETS;
						Pool[ii].Hash = h;
						Pool[ii].Next = PoolBuckets[bucketnum];
						PoolBuckets[bucketnum] = ii;
					}
					file.EndObject();
				}
			}
		}
	}
}